

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.h
# Opt level: O3

double __thiscall absl::lts_20250127::ToDoubleMicroseconds(lts_20250127 *this,Duration d)

{
  if (d.rep_hi_.lo_ != 0xffffffff) {
    return ((double)(long)this * 4000000000.0 + (double)d.rep_hi_.lo_) / 4000.0;
  }
  return *(double *)(&DAT_0048e210 + ((long)this >> 0x3f) * -8);
}

Assistant:

ABSL_ATTRIBUTE_CONST_FUNCTION constexpr bool IsInfiniteDuration(Duration d) {
  return GetRepLo(d) == ~uint32_t{0};
}